

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBench.c
# Opt level: O2

Abc_Ntk_t * Io_ReadBench(char *pFileName,int fCheck)

{
  char cVar1;
  void **ppvVar2;
  bool bVar3;
  long lVar4;
  FILE *pFile;
  int iVar5;
  int iVar6;
  uint uVar7;
  Extra_FileReader_t *p;
  char *pcVar8;
  Abc_Ntk_t *pNtk;
  Vec_Str_t *p_00;
  ProgressBar *p_01;
  Vec_Ptr_t *p_02;
  Abc_Obj_t *pAVar9;
  Abc_Obj_t *pAVar10;
  char *pcVar11;
  size_t sVar12;
  ulong uVar13;
  Mem_Flex_t *pMVar14;
  char *__format;
  char **pNamesIn;
  uint nCapMin;
  ulong uVar15;
  uint uTruth [8];
  char local_418 [1000];
  
  p = Extra_FileReaderAlloc(pFileName,"#","\n\r"," \t,()=");
  if (p == (Extra_FileReader_t *)0x0) {
    return (Abc_Ntk_t *)0x0;
  }
  pcVar8 = Extra_FileReaderGetFileName(p);
  pNtk = Abc_NtkStartRead(pcVar8);
  pNtk->nConstrs = 0;
  p_00 = (Vec_Str_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  pcVar8 = (char *)malloc(100);
  p_00->pArray = pcVar8;
  pFile = _stdout;
  iVar5 = Extra_FileReaderGetFileSize(p);
  p_01 = Extra_ProgressBarStart(pFile,iVar5);
  bVar3 = false;
LAB_002d709c:
  p_02 = (Vec_Ptr_t *)Extra_FileReaderGetTokens(p);
  if (p_02 != (Vec_Ptr_t *)0x0) {
    iVar5 = Extra_FileReaderGetCurPosition(p);
    if ((p_01 == (ProgressBar *)0x0) || (p_01->nItemsNext <= iVar5)) {
      Extra_ProgressBarUpdate_int(p_01,iVar5,(char *)0x0);
    }
    iVar5 = p_02->nSize;
    if (iVar5 == 1) {
      pcVar8 = Extra_FileReaderGetFileName(p);
      printf("%s: Wrong input file format.\n",pcVar8);
LAB_002d7937:
      Vec_StrFree(p_00);
      goto LAB_002d79a6;
    }
    ppvVar2 = p_02->pArray;
    pcVar8 = (char *)*ppvVar2;
    iVar6 = strncmp(pcVar8,"INPUT",5);
    if (iVar6 == 0) goto LAB_002d71fc;
    iVar6 = strncmp(pcVar8,"OUTPUT",5);
    pcVar11 = (char *)ppvVar2[1];
    if (iVar6 == 0) {
      Io_ReadCreatePo(pNtk,pcVar11);
    }
    else {
      if (((*pcVar11 == 'D') && (pcVar11[1] == 'F')) && (pcVar11[2] == 'F')) {
        if (iVar5 == 6) {
          pAVar9 = Abc_NtkFindOrCreateNet(pNtk,pcVar8);
          pAVar10 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
          Abc_ObjAddFanin(pAVar9,pAVar10);
          for (iVar5 = 2; iVar5 < p_02->nSize; iVar5 = iVar5 + 1) {
            pcVar11 = (char *)Vec_PtrEntry(p_02,iVar5);
            sprintf(local_418,"%s_%s",pcVar8,pcVar11);
            pAVar9 = Abc_NtkFindOrCreateNet(pNtk,pcVar11);
            pAVar9 = Abc_NtkCreateNodeBuf(pNtk,pAVar9);
            pAVar10 = Abc_NtkFindOrCreateNet(pNtk,local_418);
            Abc_ObjAddFanin(pAVar10,pAVar9);
            pAVar9 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
            Abc_ObjAddFanin(pAVar9,pAVar10);
          }
          pNtk->nConstrs = pNtk->nConstrs + 1;
        }
        else {
          pAVar9 = Io_ReadCreateLatch(pNtk,(char *)ppvVar2[2],pcVar8);
          if (pcVar11[3] == '1') {
            Abc_LatchSetInit1(pAVar9);
          }
          else if (pcVar11[3] == '0') {
            Abc_LatchSetInit0(pAVar9);
          }
          else {
            Abc_LatchSetInitDc(pAVar9);
          }
        }
        goto LAB_002d709c;
      }
      iVar6 = strcmp(pcVar11,"LUT");
      if (iVar6 == 0) {
        uVar7 = iVar5 - 3;
        if (0xb < iVar5) {
          pcVar8 = Extra_FileReaderGetFileName(p);
          printf("%s: Currently cannot read truth tables with more than 8 inputs (%d).\n",pcVar8,
                 (ulong)uVar7);
          goto LAB_002d799c;
        }
        pcVar8 = (char *)ppvVar2[2];
        if ((*pcVar8 != '0') || (pcVar8[1] != 'x')) {
          pcVar11 = Extra_FileReaderGetFileName(p);
          __format = 
          "%s: The LUT signature (%s) does not look like a hexadecimal beginning with \"0x\".\n";
          goto LAB_002d7969;
        }
        pcVar8 = pcVar8 + 2;
        uVar15 = (ulong)((uint)(1 << ((byte)uVar7 & 0x1f)) >> 2);
        if (uVar7 < 2) {
          uVar15 = 1;
        }
        sVar12 = strlen(pcVar8);
        if (sVar12 < uVar15) {
          nCapMin = (int)uVar15 - (int)sVar12;
          Vec_StrGrow(p_00,nCapMin);
          p_00->nSize = nCapMin;
          if ((int)nCapMin < 1) {
            nCapMin = 0;
          }
          for (uVar15 = 0; nCapMin != uVar15; uVar15 = uVar15 + 1) {
            p_00->pArray[uVar15] = '0';
          }
          sVar12 = strlen(pcVar8);
          uVar15 = sVar12 & 0xffffffff;
          if ((int)sVar12 < 1) {
            uVar15 = 0;
          }
          for (uVar13 = 0; uVar15 != uVar13; uVar13 = uVar13 + 1) {
            Vec_StrPush(p_00,pcVar8[uVar13]);
          }
          Vec_StrPush(p_00,'\0');
          pcVar8 = p_00->pArray;
        }
        iVar6 = Extra_ReadHexadecimal(uTruth,pcVar8,uVar7);
        if (iVar6 == 0) {
          pcVar11 = Extra_FileReaderGetFileName(p);
          printf("%s: Reading hexadecimal number (%s) has failed.\n",pcVar11,pcVar8);
          goto LAB_002d7937;
        }
        pNamesIn = (char **)(ppvVar2 + 3);
        uVar15 = (ulong)(uint)(1 << ((char)iVar5 - 8U & 0x1f));
        uVar13 = uVar15;
        if (iVar5 < 9) {
          uVar15 = 1;
          uVar13 = uVar15;
        }
        do {
          if ((long)uVar15 < 1) {
            pAVar9 = Io_ReadCreateNode(pNtk,(char *)*p_02->pArray,pNamesIn,0);
            pMVar14 = (Mem_Flex_t *)pNtk->pManFunc;
            pcVar8 = " 0\n";
            goto LAB_002d74b7;
          }
          lVar4 = uVar15 - 1;
          uVar15 = uVar15 - 1;
        } while (uTruth[lVar4] == 0);
        while (0 < (long)uVar13) {
          lVar4 = uVar13 - 1;
          uVar13 = uVar13 - 1;
          if (uTruth[lVar4] != 0xffffffff) goto code_r0x002d7403;
        }
        pAVar9 = Io_ReadCreateNode(pNtk,(char *)*p_02->pArray,pNamesIn,0);
        pMVar14 = (Mem_Flex_t *)pNtk->pManFunc;
        pcVar8 = " 1\n";
LAB_002d74b7:
        pcVar8 = Abc_SopRegister(pMVar14,pcVar8);
        (pAVar9->field_5).pData = pcVar8;
        bVar3 = true;
        goto LAB_002d709c;
      }
      iVar5 = iVar5 + -2;
      pAVar9 = Io_ReadCreateNode(pNtk,pcVar8,(char **)(ppvVar2 + 2),iVar5);
      iVar6 = strcmp(pcVar11,"AND");
      if ((iVar6 != 0) && (iVar6 = strcmp(pcVar11,"and"), iVar6 != 0)) {
        cVar1 = *pcVar11;
        if (cVar1 == 'o') {
          if (pcVar11[1] == 'r') goto LAB_002d74e1;
LAB_002d74ec:
          iVar6 = strcmp(pcVar11,"NAND");
          if ((iVar6 == 0) || (iVar6 = strcmp(pcVar11,"nand"), iVar6 == 0)) {
            pcVar8 = Abc_SopCreateNand((Mem_Flex_t *)pNtk->pManFunc,iVar5);
          }
          else {
            iVar6 = strcmp(pcVar11,"NOR");
            if ((iVar6 == 0) || (iVar6 = strcmp(pcVar11,"nor"), iVar6 == 0)) {
              pcVar8 = Abc_SopCreateNor((Mem_Flex_t *)pNtk->pManFunc,iVar5);
            }
            else {
              iVar6 = strcmp(pcVar11,"XOR");
              if ((iVar6 == 0) || (iVar6 = strcmp(pcVar11,"xor"), iVar6 == 0)) {
                pcVar8 = Abc_SopCreateXor((Mem_Flex_t *)pNtk->pManFunc,iVar5);
              }
              else {
                iVar6 = strcmp(pcVar11,"NXOR");
                if ((((iVar6 == 0) || (iVar6 = strcmp(pcVar11,"XNOR"), iVar6 == 0)) ||
                    (iVar6 = strcmp(pcVar11,"nxor"), iVar6 == 0)) ||
                   (iVar6 = strcmp(pcVar11,"xnor"), iVar6 == 0)) {
                  pcVar8 = Abc_SopCreateNxor((Mem_Flex_t *)pNtk->pManFunc,iVar5);
                }
                else if ((((cVar1 == 'B') && (pcVar11[1] == 'U')) && (pcVar11[2] == 'F')) ||
                        (iVar5 = strcmp(pcVar11,"buf"), iVar5 == 0)) {
                  pcVar8 = Abc_SopCreateBuf((Mem_Flex_t *)pNtk->pManFunc);
                }
                else {
                  iVar5 = strcmp(pcVar11,"NOT");
                  if ((iVar5 == 0) || (iVar5 = strcmp(pcVar11,"not"), iVar5 == 0)) {
                    pcVar8 = Abc_SopCreateInv((Mem_Flex_t *)pNtk->pManFunc);
                  }
                  else {
                    if ((((cVar1 != 'M') || (pcVar11[1] != 'U')) || (pcVar11[2] != 'X')) &&
                       (iVar5 = strcmp(pcVar11,"mux"), iVar5 != 0)) {
                      if (cVar1 == 'v') {
                        if ((pcVar11[1] != 'd') || (pcVar11[2] != 'd')) goto LAB_002d7a3b;
                        pMVar14 = (Mem_Flex_t *)pNtk->pManFunc;
                        pcVar8 = " 1\n";
                      }
                      else {
                        if (((cVar1 != 'g') || (pcVar11[1] != 'n')) || (pcVar11[2] != 'd')) {
LAB_002d7a3b:
                          uVar7 = Extra_FileReaderGetLineNumber(p,0);
                          printf("Io_ReadBenchNetwork(): Cannot determine gate type \"%s\" in line %d.\n"
                                 ,pcVar11,(ulong)uVar7);
                          goto LAB_002d7937;
                        }
                        pMVar14 = (Mem_Flex_t *)pNtk->pManFunc;
                        pcVar8 = " 0\n";
                      }
                      pcVar8 = Abc_SopRegister(pMVar14,pcVar8);
                      (pAVar9->field_5).pData = pcVar8;
                      goto LAB_002d709c;
                    }
                    pcVar8 = Abc_SopRegister((Mem_Flex_t *)pNtk->pManFunc,"0-1 1\n11- 1\n");
                  }
                }
              }
            }
          }
        }
        else {
          if ((cVar1 != 'O') || (pcVar11[1] != 'R')) goto LAB_002d74ec;
LAB_002d74e1:
          if (pcVar11[2] != '\0') goto LAB_002d74ec;
          pcVar8 = Abc_SopCreateOr((Mem_Flex_t *)pNtk->pManFunc,iVar5,(int *)0x0);
        }
        (pAVar9->field_5).pData = pcVar8;
        goto LAB_002d709c;
      }
      pcVar8 = Abc_SopCreateAnd((Mem_Flex_t *)pNtk->pManFunc,iVar5,(int *)0x0);
      (pAVar9->field_5).pData = pcVar8;
    }
    goto LAB_002d709c;
  }
  Extra_ProgressBarStop(p_01);
  Vec_StrFree(p_00);
  pAVar9 = Abc_NtkFindNet(pNtk,"gnd");
  if ((pAVar9 != (Abc_Obj_t *)0x0) && ((pAVar9->vFanins).nSize == 0)) {
    Io_ReadCreateConst(pNtk,"gnd",0);
  }
  pAVar9 = Abc_NtkFindNet(pNtk,"1");
  if ((pAVar9 != (Abc_Obj_t *)0x0) && ((pAVar9->vFanins).nSize == 0)) {
    puts("Io_ReadBenchNetwork(): Adding constant 0 fanin to non-driven net \"1\".");
    Io_ReadCreateConst(pNtk,"1",0);
  }
  pAVar9 = Abc_NtkFindNet(pNtk,"vdd");
  if ((pAVar9 != (Abc_Obj_t *)0x0) && ((pAVar9->vFanins).nSize == 0)) {
    Io_ReadCreateConst(pNtk,"vdd",1);
  }
  pAVar9 = Abc_NtkFindNet(pNtk,"2");
  if ((pAVar9 != (Abc_Obj_t *)0x0) && ((pAVar9->vFanins).nSize == 0)) {
    puts("Io_ReadBenchNetwork(): Adding constant 1 fanin to non-driven net \"2\".");
    Io_ReadCreateConst(pNtk,"2",1);
  }
  Abc_NtkFinalizeRead(pNtk);
  if (bVar3) {
    iVar5 = Abc_NtkToBdd(pNtk);
    if (iVar5 == 0) {
      pcVar8 = "Io_ReadBenchNetwork(): Converting to BDD has failed.";
    }
    else {
      iVar5 = Abc_NtkToSop(pNtk,-1,1000000000);
      if (iVar5 != 0) goto LAB_002d79b0;
      pcVar8 = "Io_ReadBenchNetwork(): Converting to SOP has failed.";
    }
    puts(pcVar8);
LAB_002d79a6:
    Abc_NtkDelete(pNtk);
    pNtk = (Abc_Ntk_t *)0x0;
  }
LAB_002d79b0:
  Extra_FileReaderFree(p);
  if (pNtk != (Abc_Ntk_t *)0x0) {
    if (fCheck == 0) {
      return pNtk;
    }
    iVar5 = Abc_NtkCheckRead(pNtk);
    if (iVar5 != 0) {
      return pNtk;
    }
    puts("Io_ReadBench: The network check has failed.");
    Abc_NtkDelete(pNtk);
  }
  return (Abc_Ntk_t *)0x0;
LAB_002d71fc:
  Io_ReadCreatePi(pNtk,(char *)ppvVar2[1]);
  goto LAB_002d709c;
code_r0x002d7403:
  pAVar9 = Io_ReadCreateNode(pNtk,(char *)*p_02->pArray,pNamesIn,uVar7);
  if (iVar5 < 4) {
    __assert_fail("nNames > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBench.c"
                  ,0xd7,"Abc_Ntk_t *Io_ReadBenchNetwork(Extra_FileReader_t *)");
  }
  if (iVar5 == 4) {
    if (*pcVar8 == '1') {
      pcVar8 = Abc_SopCreateInv((Mem_Flex_t *)pNtk->pManFunc);
    }
    else {
      if (*pcVar8 != '2') {
        pcVar11 = Extra_FileReaderGetFileName(p);
        __format = "%s: Reading truth table (%s) of single-input node has failed.\n";
LAB_002d7969:
        printf(__format,pcVar11,pcVar8);
LAB_002d799c:
        Vec_StrFree(p_00);
        goto LAB_002d79a6;
      }
      pcVar8 = Abc_SopCreateBuf((Mem_Flex_t *)pNtk->pManFunc);
    }
  }
  else {
    pcVar8 = Abc_SopCreateFromTruth((Mem_Flex_t *)pNtk->pManFunc,uVar7,uTruth);
  }
  (pAVar9->field_5).pData = pcVar8;
  bVar3 = true;
  goto LAB_002d709c;
}

Assistant:

Abc_Ntk_t * Io_ReadBench( char * pFileName, int fCheck )
{
    Extra_FileReader_t * p;
    Abc_Ntk_t * pNtk;

    // start the file
    p = Extra_FileReaderAlloc( pFileName, "#", "\n\r", " \t,()=" );
    if ( p == NULL )
        return NULL;

    // read the network
    pNtk = Io_ReadBenchNetwork( p );
    Extra_FileReaderFree( p );
    if ( pNtk == NULL )
        return NULL;

    // make sure that everything is okay with the network structure
    if ( fCheck && !Abc_NtkCheckRead( pNtk ) )
    {
        printf( "Io_ReadBench: The network check has failed.\n" );
        Abc_NtkDelete( pNtk );
        return NULL;
    }
    return pNtk;
}